

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * __thiscall
Peeps::HoistSameInstructionAboveSplit(Peeps *this,BranchInstr *branchInstr,Instr *instrNext)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  LabelInstr *oldLabelInstr;
  Instr *pIVar8;
  Instr *pIVar9;
  Instr *pIVar10;
  BranchInstr *this_00;
  LabelInstr *pLVar11;
  bool local_b2;
  bool local_9a;
  byte local_99;
  BranchInstr *tailBranch;
  Instr *instrHasHoisted;
  Instr *targetNextInstr;
  Instr *branchNextInstr;
  Instr *targetInstr;
  Instr *instr;
  Instr *pIStack_58;
  bool hoistAboveSetConditionInstr;
  Instr *branchPrev;
  Instr *instrSetCondition;
  Instr *targetPrev;
  LabelInstr *targetLabel;
  Instr *instrNext_local;
  BranchInstr *branchInstr_local;
  Peeps *this_local;
  
  if (branchInstr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x2aa,"(branchInstr)","branchInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = IR::BranchInstr::IsConditional(branchInstr);
  this_local = (Peeps *)instrNext;
  if (((bVar2) && (bVar2 = IR::BranchInstr::IsMultiBranch(branchInstr), !bVar2)) &&
     (bVar2 = IR::Instr::IsLowered(&branchInstr->super_Instr), bVar2)) {
    oldLabelInstr = IR::BranchInstr::GetTarget(branchInstr);
    if (oldLabelInstr == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x2b1,"(targetLabel)","targetLabel");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar5 = RealCount::Count(&(oldLabelInstr->labelRefs).
                              super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                              super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                              super_RealCount);
    if (uVar5 < 2) {
      pIVar8 = IR::Instr::GetPrevRealInstrOrLabel(&oldLabelInstr->super_Instr);
      if (pIVar8 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,699,"(targetPrev)","targetPrev");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = IR::Instr::HasFallThrough(pIVar8);
      if (!bVar2) {
        branchPrev = (Instr *)0x0;
        pIStack_58 = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
        while( true ) {
          local_99 = 0;
          if (pIStack_58 != (Instr *)0x0) {
            bVar2 = IR::Instr::StartsBasicBlock(pIStack_58);
            local_99 = bVar2 ^ 0xff;
          }
          if ((local_99 & 1) == 0) break;
          if ((branchPrev == (Instr *)0x0) &&
             (bVar2 = EncoderMD::SetsConditionCode(pIStack_58), bVar2)) {
            branchPrev = pIStack_58;
          }
          pIStack_58 = IR::Instr::GetPrevRealInstrOrLabel(pIStack_58);
        }
        if (pIStack_58 != (Instr *)0x0) {
          IVar3 = IR::Instr::GetKind(pIStack_58);
          local_9a = true;
          if (IVar3 != InstrKindLabel) {
            local_9a = IR::Instr::IsProfiledLabelInstr(pIStack_58);
          }
          if ((local_9a != false) &&
             (pLVar11 = IR::Instr::AsLabelInstr(pIStack_58),
             ((byte)pLVar11->field_0x78 >> 1 & 1) != 0)) {
            return instrNext;
          }
        }
        if (branchPrev != (Instr *)0x0) {
          if (branchPrev == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x2d5,"(instrSetCondition)","instrSetCondition");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          pIVar8 = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
          targetInstr = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
          branchNextInstr = IR::Instr::GetNextRealInstrOrLabel(&oldLabelInstr->super_Instr);
          tailBranch = (BranchInstr *)0x0;
          if ((targetInstr == (Instr *)0x0) || (branchNextInstr == (Instr *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x2e3,"(instr && targetInstr)","instr && targetInstr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          while( true ) {
            bVar4 = IR::Instr::EndsBasicBlock(targetInstr);
            bVar2 = false;
            if (!bVar4) {
              IVar3 = IR::Instr::GetKind(targetInstr);
              local_b2 = true;
              if (IVar3 != InstrKindLabel) {
                local_b2 = IR::Instr::IsProfiledLabelInstr(targetInstr);
              }
              bVar2 = false;
              if (local_b2 == false) {
                bVar4 = IR::Instr::IsEqual(targetInstr,branchNextInstr);
                bVar2 = false;
                if (bVar4) {
                  bVar4 = EncoderMD::UsesConditionCode(targetInstr);
                  bVar2 = false;
                  if (!bVar4) {
                    bVar4 = EncoderMD::SetsConditionCode(targetInstr);
                    bVar2 = false;
                    if (!bVar4) {
                      bVar4 = AgenPeeps::DependentInstrs(&this->peepsAgen,branchPrev,targetInstr);
                      bVar2 = false;
                      if (!bVar4) {
                        bVar2 = targetInstr->m_opcode != InlineeStart;
                      }
                    }
                  }
                }
              }
            }
            if (!bVar2) break;
            pIVar9 = IR::Instr::GetNextRealInstrOrLabel(targetInstr);
            pIVar10 = IR::Instr::GetNextRealInstrOrLabel(branchNextInstr);
            IR::Instr::Unlink(targetInstr);
            if (branchPrev == pIVar8) {
              IR::Instr::InsertBefore(branchPrev,targetInstr);
            }
            else {
              IR::Instr::InsertBefore(&branchInstr->super_Instr,targetInstr);
            }
            IR::Instr::Remove(branchNextInstr);
            if (tailBranch == (BranchInstr *)0x0) {
              tailBranch = (BranchInstr *)targetInstr;
            }
            branchNextInstr = pIVar10;
            targetInstr = pIVar9;
            if ((pIVar9 == (Instr *)0x0) || (pIVar10 == (Instr *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                 ,0x2fe,"(instr && targetInstr)","instr && targetInstr");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          }
          if (tailBranch != (BranchInstr *)0x0) {
            bVar2 = IR::Instr::IsBranchInstr(branchNextInstr);
            if (bVar2) {
              this_00 = IR::Instr::AsBranchInstr(branchNextInstr);
              bVar2 = IR::BranchInstr::IsUnconditional(this_00);
              if ((bVar2) && (bVar2 = IR::BranchInstr::IsMultiBranch(this_00), !bVar2)) {
                pLVar11 = IR::BranchInstr::GetTarget(this_00);
                IR::BranchInstr::ReplaceTarget(branchInstr,oldLabelInstr,pLVar11);
              }
              BVar6 = IR::LabelInstr::IsUnreferenced(oldLabelInstr);
              if (BVar6 != 0) {
                PeepUnreachableLabel
                          (oldLabelInstr,((byte)oldLabelInstr->field_0x78 >> 1 & 1) != 0,(bool *)0x0
                          );
              }
            }
            this_local = (Peeps *)tailBranch;
          }
        }
      }
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Peeps::HoistSameInstructionAboveSplit(IR::BranchInstr *branchInstr, IR::Instr *instrNext)
{
    Assert(branchInstr);
    if (!branchInstr->IsConditional() || branchInstr->IsMultiBranch() || !branchInstr->IsLowered())
    {
        return instrNext;   // this optimization only applies to single conditional branch
    }

    IR::LabelInstr *targetLabel = branchInstr->GetTarget();
    Assert(targetLabel);

    // give up if there are other branch entries to the target label
    if (targetLabel->labelRefs.Count() > 1)
    {
        return instrNext;
    }

    // Give up if previous instruction before target label has fallthrough, cannot hoist up
    IR::Instr *targetPrev = targetLabel->GetPrevRealInstrOrLabel();
    Assert(targetPrev);
    if (targetPrev->HasFallThrough())
    {
        return instrNext;
    }

    IR::Instr *instrSetCondition = NULL;
    IR::Instr *branchPrev = branchInstr->GetPrevRealInstrOrLabel();
    while (branchPrev && !branchPrev->StartsBasicBlock())
    {
        if (!instrSetCondition && EncoderMD::SetsConditionCode(branchPrev))
        {   // located compare instruction for the branch
            instrSetCondition = branchPrev;
        }
        branchPrev = branchPrev->GetPrevRealInstrOrLabel(); // keep looking previous instr in BB
    }

    if (branchPrev && branchPrev->IsLabelInstr() && branchPrev->AsLabelInstr()->isOpHelper)
    {   // don't apply the optimization when branch is in helper section
        return instrNext;
    }

    if (!instrSetCondition)
    {   // give up if we cannot find the compare instruction in the BB, should be very rare
        return instrNext;
    }
    Assert(instrSetCondition);

    bool hoistAboveSetConditionInstr = false;
    if (instrSetCondition == branchInstr->GetPrevRealInstrOrLabel())
    {   // if compare instruction is right before branch instruction, we can hoist above cmp instr
        hoistAboveSetConditionInstr = true;
    }   // otherwise we hoist the identical instructions above conditional branch split only

    IR::Instr *instr = branchInstr->GetNextRealInstrOrLabel();
    IR::Instr *targetInstr = targetLabel->GetNextRealInstrOrLabel();
    IR::Instr *branchNextInstr = NULL;
    IR::Instr *targetNextInstr = NULL;
    IR::Instr *instrHasHoisted = NULL;

    Assert(instr && targetInstr);
    while (!instr->EndsBasicBlock() && !instr->IsLabelInstr() && instr->IsEqual(targetInstr) &&
        !EncoderMD::UsesConditionCode(instr) && !EncoderMD::SetsConditionCode(instr) &&
        !this->peepsAgen.DependentInstrs(instrSetCondition, instr) &&
        // cannot hoist InlineeStart from branch targets even for the same inlinee function.
        // it is used by encoder to generate InlineeFrameRecord for each inlinee
        instr->m_opcode != Js::OpCode::InlineeStart)
    {
        branchNextInstr = instr->GetNextRealInstrOrLabel();
        targetNextInstr = targetInstr->GetNextRealInstrOrLabel();

        instr->Unlink();                            // hoist up instr in fallthrough branch
        if (hoistAboveSetConditionInstr)
        {
            instrSetCondition->InsertBefore(instr); // hoist above compare instruction
        }
        else
        {
            branchInstr->InsertBefore(instr);       // hoist above branch split
        }
        targetInstr->Remove();                      // remove the same instruction in target branch

        if (!instrHasHoisted)
            instrHasHoisted = instr;                // points to the first hoisted instruction

        instr = branchNextInstr;
        targetInstr = targetNextInstr;
        Assert(instr && targetInstr);
    }

    if (instrHasHoisted)
    {   // instructions have been hoisted, now check tail branch to see if it can be duplicated
        if (targetInstr->IsBranchInstr())
        {
            IR::BranchInstr *tailBranch = targetInstr->AsBranchInstr();
            if (tailBranch->IsUnconditional() && !tailBranch->IsMultiBranch())
            {   // target can be replaced since tail branch is a single unconditional jmp
                branchInstr->ReplaceTarget(targetLabel, tailBranch->GetTarget());
            }

            // now targeLabel is an empty Basic Block, remove it if it's not referenced
            if (targetLabel->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetLabel, targetLabel->isOpHelper);
            }
        }
        return instrHasHoisted;
    }

    return instrNext;
}